

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O1

callback_t *
end_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QTextStream *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  QByteArrayView QVar1;
  QTextStream *local_50;
  QString local_48;
  undefined4 local_30;
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  undefined8 local_18;
  
  std::istream::ignore();
  parser();
  if ((parser()::category[0x10] & 1) != 0) {
    parser();
    local_30 = 2;
    local_2c = 0;
    uStack_24 = 0;
    local_1c = 0;
    local_18 = parser()::category._8_8_;
    QMessageLogger::debug();
    this = local_50;
    QVar1.m_data = (storage_type *)0x10;
    QVar1.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<(this,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
      }
    }
    if (local_50[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_50,' ');
    }
    operator<<((QDebug *)&local_50,(string *)((anonymous_namespace)::current_class + 0x40));
    QDebug::~QDebug((QDebug *)&local_50);
  }
  __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((anonymous_namespace)::current_class + 0x38);
  (anonymous_namespace)::current_class = *(long *)((anonymous_namespace)::current_class + 0x30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DAT_00119300,__r);
  if ((anonymous_namespace)::current_class == 0) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = class_state;
    __return_storage_ptr__->_M_invoker =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_invoke;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         std::
         _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
         ::_M_manager;
  }
  return __return_storage_ptr__;
}

Assistant:

callback_t end_class_state(MetaConfiguration &conf, std::ifstream &f,
                           int &error) {
  f.ignore();
  qCDebug(parser) << "finishing class " << current_class->name;
  current_class = current_class->parent;

  if (current_class)
    return class_state;
  return nullptr;
}